

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

Result __thiscall spectest::JSONParser::ParseModuleType(JSONParser *this,ModuleType *out_type)

{
  bool bVar1;
  Result RVar2;
  Enum EVar3;
  string module_type_str;
  
  module_type_str._M_dataplus._M_p = (pointer)&module_type_str.field_2;
  module_type_str._M_string_length = 0;
  module_type_str.field_2._M_local_buf[0] = '\0';
  RVar2 = ParseKeyStringValue(this,"module_type",&module_type_str);
  EVar3 = Error;
  if (RVar2.enum_ != Error) {
    bVar1 = std::operator==(&module_type_str,"text");
    if (bVar1) {
      *out_type = Text;
    }
    else {
      bVar1 = std::operator==(&module_type_str,"binary");
      if (!bVar1) {
        PrintError(this,"unknown module type: \"%s\"",module_type_str._M_dataplus._M_p);
        goto LAB_00184c65;
      }
      *out_type = Binary;
    }
    EVar3 = Ok;
  }
LAB_00184c65:
  std::__cxx11::string::_M_dispose();
  return (Result)EVar3;
}

Assistant:

wabt::Result JSONParser::ParseModuleType(ModuleType* out_type) {
  std::string module_type_str;

  PARSE_KEY_STRING_VALUE("module_type", &module_type_str);
  if (module_type_str == "text") {
    *out_type = ModuleType::Text;
    return wabt::Result::Ok;
  } else if (module_type_str == "binary") {
    *out_type = ModuleType::Binary;
    return wabt::Result::Ok;
  } else {
    PrintError("unknown module type: \"%s\"", module_type_str.c_str());
    return wabt::Result::Error;
  }
}